

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O0

REF_STATUS ref_matrix_descending_eig_twod(REF_DBL *d)

{
  REF_DBL RVar1;
  double local_60;
  REF_DBL znorm [3];
  double local_38;
  REF_DBL best_dot;
  REF_DBL dot;
  REF_INT zdir;
  REF_INT i;
  REF_DBL temp;
  REF_DBL *d_local;
  
  local_38 = -2.0;
  dot._0_4_ = -1;
  for (dot._4_4_ = 0; dot._4_4_ < 3; dot._4_4_ = dot._4_4_ + 1) {
    if (d[(long)(dot._4_4_ * 3 + 3) + 2] * 1.0 +
        d[dot._4_4_ * 3 + 3] * 0.0 + d[(long)(dot._4_4_ * 3 + 3) + 1] * 0.0 <= 0.0) {
      local_60 = -(d[(long)(dot._4_4_ * 3 + 3) + 2] * 1.0 +
                  d[dot._4_4_ * 3 + 3] * 0.0 + d[(long)(dot._4_4_ * 3 + 3) + 1] * 0.0);
    }
    else {
      local_60 = d[(long)(dot._4_4_ * 3 + 3) + 2] * 1.0 +
                 d[dot._4_4_ * 3 + 3] * 0.0 + d[(long)(dot._4_4_ * 3 + 3) + 1] * 0.0;
    }
    if (local_38 < local_60) {
      local_38 = local_60;
      dot._0_4_ = dot._4_4_;
    }
  }
  if (dot._0_4_ == -1) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_matrix.c",0x175,
           "ref_matrix_descending_eig_twod","better dot not found, no z preference");
    d_local._4_4_ = 1;
  }
  else {
    if (dot._0_4_ != 2) {
      RVar1 = d[2];
      d[2] = d[dot._0_4_];
      d[dot._0_4_] = RVar1;
      for (dot._4_4_ = 0; dot._4_4_ < 3; dot._4_4_ = dot._4_4_ + 1) {
        RVar1 = d[dot._4_4_ + 9];
        d[dot._4_4_ + 9] = d[dot._4_4_ + 3 + dot._0_4_ * 3];
        d[dot._4_4_ + 3 + dot._0_4_ * 3] = RVar1;
      }
    }
    if (*d <= d[1] && d[1] != *d) {
      RVar1 = *d;
      *d = d[1];
      d[1] = RVar1;
      for (dot._4_4_ = 0; dot._4_4_ < 3; dot._4_4_ = dot._4_4_ + 1) {
        RVar1 = d[dot._4_4_ + 3];
        d[dot._4_4_ + 3] = d[dot._4_4_ + 6];
        d[dot._4_4_ + 6] = RVar1;
      }
    }
    d_local._4_4_ = 0;
  }
  return d_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_matrix_descending_eig_twod(REF_DBL *d) {
  REF_DBL temp;
  REF_INT i, zdir;
  REF_DBL dot, best_dot;
  REF_DBL znorm[] = {0, 0, 1};

  best_dot = -2.0;
  zdir = REF_EMPTY;
  for (i = 0; i < 3; i++) {
    dot = ABS(ref_math_dot(znorm, ref_matrix_vec_ptr(d, i)));
    if (dot > best_dot) {
      best_dot = dot;
      zdir = i;
    }
  }
  RUS(REF_EMPTY, zdir, "better dot not found, no z preference");

  if (2 != zdir) {
    temp = ref_matrix_eig(d, 2);
    ref_matrix_eig(d, 2) = ref_matrix_eig(d, zdir);
    ref_matrix_eig(d, zdir) = temp;
    for (i = 0; i < 3; i++) {
      temp = ref_matrix_vec(d, i, 2);
      ref_matrix_vec(d, i, 2) = ref_matrix_vec(d, i, zdir);
      ref_matrix_vec(d, i, zdir) = temp;
    }
  }

  if (ref_matrix_eig(d, 1) > ref_matrix_eig(d, 0)) {
    temp = ref_matrix_eig(d, 0);
    ref_matrix_eig(d, 0) = ref_matrix_eig(d, 1);
    ref_matrix_eig(d, 1) = temp;
    for (i = 0; i < 3; i++) {
      temp = ref_matrix_vec(d, i, 0);
      ref_matrix_vec(d, i, 0) = ref_matrix_vec(d, i, 1);
      ref_matrix_vec(d, i, 1) = temp;
    }
  }

  return REF_SUCCESS;
}